

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnscapPlugIn.cpp
# Opt level: O2

void libithicap_output(char *descr,iaddr from,iaddr to,uint8_t proto,uint flags,uint sport,
                      uint dport,my_bpftimeval ts,u_char *pkt_copy,uint olen,u_char *payload,
                      uint payloadlen)

{
  size_t source_addr_length;
  size_t dest_addr_length;
  
  if (((libithicap_stats != (DnsStats *)0x0) && ((flags & 2) != 0)) &&
     (libithicap_stats->is_capture_stopped == false)) {
    source_addr_length = 0x10;
    if (from.af == 2) {
      source_addr_length = 4;
    }
    dest_addr_length = 0x10;
    if (to.af == 2) {
      dest_addr_length = 4;
    }
    DnsStats::SubmitPacket
              (libithicap_stats,payload,payloadlen,(uint8_t *)&from.u,source_addr_length,
               (uint8_t *)&to.u,dest_addr_length,ts);
  }
  return;
}

Assistant:

void libithicap_output(const char* descr, iaddr from, iaddr to, uint8_t proto, 
        unsigned flags,
        unsigned sport, unsigned dport, my_bpftimeval ts,
        const u_char* pkt_copy, const unsigned olen,
        const u_char* payload, const unsigned payloadlen)
    {
        /* Need to do a little bit of massaging between the version of 
         * addresses used by DNSCAP and that used by ITHITOOLS */
        uint8_t * source_addr;
        size_t source_addr_length;
        uint8_t * dest_addr;
        size_t dest_addr_length;

        UNREFERENCED_PARAMETER(descr);
        UNREFERENCED_PARAMETER(proto);
        UNREFERENCED_PARAMETER(sport);
        UNREFERENCED_PARAMETER(dport);
        UNREFERENCED_PARAMETER(ts);
        UNREFERENCED_PARAMETER(pkt_copy);
        UNREFERENCED_PARAMETER(olen);


        if (libithicap_stats == NULL ||
            libithicap_stats->IsCaptureStopped()) {
            return;
        }

        if ((flags & DNSCAP_OUTPUT_ISDNS) == 0)
        {
            /* A fragment, not a DNS Packet */
            return;
        }

        switch (from.af)
        {
        case AF_INET:
            source_addr = (uint8_t *) &from.u.a4;
            source_addr_length = 4;
            break;
        default:
            source_addr = (uint8_t *)&from.u.a6;
            source_addr_length = 16;
            break;
        }

        switch (to.af)
        {
        case AF_INET:
            dest_addr = (uint8_t *)&to.u.a4;
            dest_addr_length = 4;
            break;
        default:
            dest_addr = (uint8_t *)&to.u.a6;
            dest_addr_length = 16;
            break;
        }

        libithicap_stats->SubmitPacket((uint8_t *)payload, payloadlen,
            source_addr, source_addr_length, dest_addr, dest_addr_length, ts);
    }